

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* xsettingsd::SplitString
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,string *delim)

{
  long lVar1;
  ulong uVar2;
  string *psVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  value_type local_a8;
  value_type local_88;
  long local_68;
  size_t next;
  ulong local_40;
  size_t start;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21;
  string *local_20;
  string *delim_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parts;
  
  local_20 = delim;
  delim_local = str;
  str_local = (string *)__return_storage_ptr__;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    uVar4 = std::__cxx11::string::empty();
    psVar3 = delim_local;
    if ((uVar4 & 1) == 0) {
      start._3_1_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__);
      local_40 = 0;
      while (uVar4 = local_40, uVar5 = std::__cxx11::string::size(), uVar2 = local_40,
            uVar4 <= uVar5) {
        uVar4 = std::__cxx11::string::size();
        if (uVar2 == uVar4) {
          std::__cxx11::string::string((string *)&next);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&next);
          std::__cxx11::string::~string((string *)&next);
          return __return_storage_ptr__;
        }
        local_68 = std::__cxx11::string::find((string *)delim_local,(ulong)local_20);
        psVar3 = delim_local;
        if (local_68 == -1) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&local_88,(ulong)psVar3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          return __return_storage_ptr__;
        }
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)delim_local);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        lVar1 = local_68;
        lVar6 = std::__cxx11::string::size();
        local_40 = lVar1 + lVar6;
      }
    }
    else {
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_21);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__,1,psVar3,&local_21);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_21);
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> SplitString(const string& str, const string& delim) {
  if (str.empty())
    return vector<string>();
  if (delim.empty())
    return vector<string>(1, str);

  vector<string> parts;
  size_t start = 0;
  while (start <= str.size()) {
    if (start == str.size()) {
      parts.push_back(string());
      break;
    }
    size_t next = str.find(delim, start);
    if (next == string::npos) {
      parts.push_back(str.substr(start, str.size() - start));
      break;
    }
    parts.push_back(str.substr(start, next - start));
    start = next + delim.size();
  }
  return parts;
}